

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O0

void __thiscall Am_Style_Data::~Am_Style_Data(Am_Style_Data *this)

{
  Color_Index *pCVar1;
  undefined8 uVar2;
  Colormap c_1;
  int screen_num_1;
  Color_Index *next;
  Color_Index *current;
  Colormap c;
  int screen_num;
  Am_Style_Data *this_local;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411658;
  if (((this->color_name != (char *)0x0) && ((this->color_allocated & 1U) != 0)) &&
     (this->color_name != (char *)0x0)) {
    operator_delete__(this->color_name);
  }
  if ((this->dash_list != (char *)0x0) && (this->dash_list != (char *)0x0)) {
    operator_delete__(this->dash_list);
  }
  if ((this->main_display != (Display *)0x0) && ((this->color_allocated & 1U) != 0)) {
    uVar2 = XDefaultColormap(this->main_display,*(undefined4 *)(this->main_display + 0xe0));
    XFreeColors(this->main_display,uVar2,&this->main_color,1,0);
  }
  pCVar1 = this->color_head;
  while (next = pCVar1, next != (Color_Index *)0x0) {
    pCVar1 = next->next;
    next->next = (Color_Index *)0x0;
    if ((next->dpy != (Display *)0x0) && ((this->color_allocated & 1U) != 0)) {
      uVar2 = XDefaultColormap(next->dpy,*(undefined4 *)(next->dpy + 0xe0));
      XFreeColors(next->dpy,uVar2,&next->index,1,0);
    }
    if (next != (Color_Index *)0x0) {
      operator_delete(next);
    }
  }
  this->color_head = (Color_Index *)0x0;
  remove((char *)this);
  Am_Image_Array::~Am_Image_Array(&this->stipple_bitmap);
  Am_Wrapper::~Am_Wrapper(&this->super_Am_Wrapper);
  return;
}

Assistant:

Am_Style_Data::~Am_Style_Data()
{
  if (color_name && color_allocated)
    delete[] color_name;
  if (dash_list)
    delete[] dash_list;
  if (main_display) {
    // BUG: X index deletion will not work properly if some application
    // has changed the default colormap.
    // I'm not sure that's actually a bug (af1x 12-6-95)
    if (color_allocated) {
      int screen_num = DefaultScreen(main_display);
      Colormap c = XDefaultColormap(main_display, screen_num);
      XFreeColors(main_display, c, &main_color.pixel, 1, 0);
      // simulate an array of length 1
    }
  }
  Color_Index *current = color_head;
  Color_Index *next = nullptr;
  while (current) {
    next = current->next;
    current->next = nullptr;
    if (current->dpy) {
      if (color_allocated) {
        int screen_num = DefaultScreen(current->dpy);
        Colormap c = XDefaultColormap(current->dpy, screen_num);
        XFreeColors(current->dpy, c, &current->index.pixel, 1, 0);
        // simulate an array of length 1
      }
    }
    delete current;
    current = next;
  }
  color_head = nullptr;
  remove(this);
}